

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListFile.cpp
# Opt level: O1

size_t ListFile_GetNextLine(void *pvListFile,char **pszLineBegin,char **pszLineEnd)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar5 = *(char **)((long)pvListFile + 8);
  pcVar2 = *(char **)((long)pvListFile + 0x10);
  if (pcVar5 < pcVar2) {
    do {
      if (' ' < *pcVar5) break;
      pcVar5 = pcVar5 + 1;
      *(char **)((long)pvListFile + 8) = pcVar5;
    } while (pcVar5 != pcVar2);
  }
  pcVar6 = *(char **)((long)pvListFile + 8);
  pcVar4 = (char *)0x0;
  if (pcVar6 < pcVar2) {
    do {
      cVar1 = *pcVar6;
      pcVar3 = pcVar6;
      if ((cVar1 != '~') && ((cVar1 == '\n' || (pcVar3 = pcVar4, cVar1 == '\r')))) break;
      pcVar6 = pcVar6 + 1;
      *(char **)((long)pvListFile + 8) = pcVar6;
      pcVar4 = pcVar3;
    } while (pcVar6 != pcVar2);
  }
  if (((pcVar4 == (char *)0x0) || (*pcVar4 != '~')) || (pcVar4[1] != 'P')) {
    pcVar4 = pcVar6;
  }
  *pszLineBegin = pcVar5;
  *pszLineEnd = pcVar4;
  return (long)pcVar4 - (long)pcVar5;
}

Assistant:

size_t ListFile_GetNextLine(void * pvListFile, const char ** pszLineBegin, const char ** pszLineEnd)
{
    PLISTFILE_CACHE pCache = (PLISTFILE_CACHE)pvListFile;
    char * szExtraString = NULL;
    char * szLineBegin;
    char * szLineEnd;

    // Skip newlines, spaces, tabs and another non-printable stuff
    while(pCache->pPos < pCache->pEnd && pCache->pPos[0] <= 0x20)
        pCache->pPos++;

    // Remember the begin of the line
    szLineBegin = pCache->pPos;

    // Copy the remaining characters
    while(pCache->pPos < pCache->pEnd)
    {
        // If we have found a newline, stop loading
        // Note: the 0x85 char came from Overwatch build 24919
        if(pCache->pPos[0] == 0x0A || pCache->pPos[0] == 0x0D || pCache->pPos[0] == 0x85)
            break;

        // Blizzard listfiles can also contain information about patch:
        // Pass1\Files\MacOS\unconditional\user\Background Downloader.app\Contents\Info.plist~Patch(Data#frFR#base-frFR,1326)
        if(pCache->pPos[0] == '~')
            szExtraString = pCache->pPos;

        // Move the position by one character forward
        pCache->pPos++;
    }

    // Remember the end of the line
    szLineEnd = (szExtraString != NULL && szExtraString[0] == '~' && szExtraString[1] == 'P') ? szExtraString : pCache->pPos;

    // Give the caller the positions of the begin and end of the line
    pszLineBegin[0] = szLineBegin;
    pszLineEnd[0] = szLineEnd;
    return (size_t)(szLineEnd - szLineBegin);
}